

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall Config::SetInt(Config *this,string *key,int val)

{
  mapped_type *this_00;
  stringstream ss;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,val);
  std::__cxx11::stringbuf::str();
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->config_,key);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void Config::SetInt(string key, int val)
{
    stringstream ss;
    ss << val;
    config_[key] = ss.str();
}